

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONValue.cpp
# Opt level: O2

wstring * __thiscall
JSONValue::Indent_abi_cxx11_(wstring *__return_storage_ptr__,JSONValue *this,size_t depth)

{
  if (this != (JSONValue *)0x0) {
    this = (JSONValue *)((long)this * 2 + -2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct((ulong)__return_storage_ptr__,(wchar_t)this);
  return __return_storage_ptr__;
}

Assistant:

std::wstring JSONValue::Indent(size_t depth)
{
	const size_t indent_step = 2;
	depth ? --depth : 0;
	std::wstring indentStr(depth * indent_step, ' ');
	return indentStr;
}